

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O1

void curlpp::
     InfoTypeConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::get(Easy *handle,CURLINFO info,string *value)

{
  CurlHandle *pCVar1;
  char *pcVar2;
  CURLcode code;
  undefined4 in_register_00000034;
  char *tmp;
  char *local_20;
  
  pCVar1 = (handle->mCurl)._M_ptr;
  code = curl_easy_getinfo(pCVar1->mCurl,CONCAT44(in_register_00000034,info),&local_20);
  libcurlRuntimeAssert(pCVar1->mErrorBuffer,code);
  pcVar2 = (char *)value->_M_string_length;
  strlen(local_20);
  std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)local_20);
  return;
}

Assistant:

void
InfoTypeConverter<std::string>::get(const curlpp::Easy & handle, 
				      CURLINFO info,
				      std::string & value)
{
  char * tmp;
  InfoGetter::get(handle, info, tmp);
  value = tmp;
}